

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O2

void testStandardAttributes(string *tempDir)

{
  float *pfVar1;
  Rgba *pRVar2;
  unsigned_short uVar3;
  undefined8 uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  Header *pHVar10;
  Chromaticities *pCVar11;
  Box2i *pBVar12;
  Rgba *pRVar13;
  half *phVar14;
  KeyCode *this;
  char *pcVar15;
  int face_1;
  CubeMapFace CVar16;
  half *this_00;
  V2f *pVVar17;
  CubeMapFace face_00;
  long lVar18;
  char *__assertion;
  int y;
  int iVar19;
  long lVar20;
  int x;
  long lVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  V3f R1;
  int iStack_4a4;
  V3f G1;
  int local_484;
  V3f R2;
  CubeMapFace face;
  V3f B1;
  Chromaticities c;
  V3f W1;
  V3f G2;
  M44f M2;
  CubeMapFace face_2;
  V3f B2;
  Rand48 rand_1;
  undefined2 uStack_392;
  Vec3<float> local_388;
  V3f W2;
  Vec2<float> local_360;
  M44f M1;
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  
  poVar9 = std::operator<<((ostream *)&std::cout,"Testing optional standard attributes");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"conversion from RGB to XYZ");
  std::endl<char,std::char_traits<char>>(poVar9);
  M1.x[0][0] = 0.64;
  M1.x[0][1] = 0.33;
  M2.x[0][0] = 0.3;
  M2.x[0][1] = 0.6;
  R1.x = 0.15;
  R1.y = 0.06;
  G1.x = 0.3127;
  G1.y = 0.329;
  Imf_2_5::Chromaticities::Chromaticities(&c,(V2f *)&M1,(V2f *)&M2,(V2f *)&R1,(V2f *)&G1);
  Imf_2_5::RGBtoXYZ(&M1,&c,100.0);
  M2.x[0][0] = 1.0;
  M2.x[0][1] = 0.0;
  M2.x[0][2] = 0.0;
  Imath_2_5::operator*((Vec3<float> *)&M2,&M1);
  M2.x[0][0] = 0.0;
  M2.x[0][1] = 1.0;
  M2.x[0][2] = 0.0;
  Imath_2_5::operator*((Vec3<float> *)&M2,&M1);
  M2.x[0][0] = 0.0;
  M2.x[0][1] = 0.0;
  M2.x[0][2] = 1.0;
  Imath_2_5::operator*((Vec3<float> *)&M2,&M1);
  M2.x[0][0] = 1.0;
  M2.x[0][1] = 1.0;
  M2.x[0][2] = 1.0;
  Imath_2_5::operator*((Vec3<float> *)&M2,&M1);
  poVar9 = std::operator<<((ostream *)&std::cout,"red   XYZ = ");
  poVar9 = Imath_2_5::operator<<(poVar9,&R1);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"green XYZ = ");
  poVar9 = Imath_2_5::operator<<(poVar9,&G1);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"blue  XYZ = ");
  poVar9 = Imath_2_5::operator<<(poVar9,&B1);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"white XYZ = ");
  poVar9 = Imath_2_5::operator<<(poVar9,&W1);
  std::endl<char,std::char_traits<char>>(poVar9);
  auVar25._8_8_ = 0;
  auVar25._0_4_ = R1.x;
  auVar25._4_4_ = R1.y;
  fVar24 = R1.y;
  auVar28._4_4_ = fVar24;
  auVar28._0_4_ = fVar24;
  auVar28._8_4_ = fVar24;
  auVar28._12_4_ = fVar24;
  auVar29._4_12_ = auVar28._4_12_;
  auVar29._0_4_ = fVar24 + R1.x + R1.z;
  auVar31._0_8_ = auVar29._0_8_;
  auVar31._8_4_ = fVar24;
  auVar31._12_4_ = fVar24;
  auVar30._8_8_ = auVar31._8_8_;
  auVar30._4_4_ = auVar29._0_4_;
  auVar30._0_4_ = auVar29._0_4_;
  auVar25 = divps(auVar25,auVar30);
  _rand_1 = auVar25._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_4_ = G1.x;
  auVar26._4_4_ = G1.y;
  fVar24 = G1.y;
  auVar32._4_4_ = fVar24;
  auVar32._0_4_ = fVar24;
  auVar32._8_4_ = fVar24;
  auVar32._12_4_ = fVar24;
  auVar33._4_12_ = auVar32._4_12_;
  auVar33._0_4_ = fVar24 + G1.x + G1.z;
  auVar35._0_8_ = auVar33._0_8_;
  auVar35._8_4_ = fVar24;
  auVar35._12_4_ = fVar24;
  auVar34._8_8_ = auVar35._8_8_;
  auVar34._4_4_ = auVar33._0_4_;
  auVar34._0_4_ = auVar33._0_4_;
  auVar25 = divps(auVar26,auVar34);
  _face = auVar25._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = B1.x;
  auVar27._4_4_ = B1.y;
  fVar24 = B1.y;
  auVar36._4_4_ = fVar24;
  auVar36._0_4_ = fVar24;
  auVar36._8_4_ = fVar24;
  auVar36._12_4_ = fVar24;
  auVar37._4_12_ = auVar36._4_12_;
  auVar37._0_4_ = fVar24 + B1.x + B1.z;
  auVar39._0_8_ = auVar37._0_8_;
  auVar39._8_4_ = fVar24;
  auVar39._12_4_ = fVar24;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._4_4_ = auVar37._0_4_;
  auVar38._0_4_ = auVar37._0_4_;
  auVar25 = divps(auVar27,auVar38);
  auVar40._4_4_ = W1.y;
  auVar40._0_4_ = W1.x;
  auVar40._8_8_ = 0;
  auVar41._4_4_ = W1.y;
  auVar41._0_4_ = W1.y;
  auVar41._8_4_ = W1.y;
  auVar41._12_4_ = W1.y;
  auVar42._4_12_ = auVar41._4_12_;
  auVar42._0_4_ = W1.y + W1.x + W1.z;
  _face_2 = auVar25._0_8_;
  auVar44._0_8_ = auVar42._0_8_;
  auVar44._8_4_ = W1.y;
  auVar44._12_4_ = W1.y;
  auVar43._8_8_ = auVar44._8_8_;
  auVar43._4_4_ = auVar42._0_4_;
  auVar43._0_4_ = auVar42._0_4_;
  auVar25 = divps(auVar40,auVar43);
  local_360 = auVar25._0_8_;
  poVar9 = std::operator<<((ostream *)&std::cout,"red   xy = ");
  poVar9 = Imath_2_5::operator<<(poVar9,(Vec2<float> *)&rand_1);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"green xy = ");
  poVar9 = Imath_2_5::operator<<(poVar9,(Vec2<float> *)&face);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"blue  xy = ");
  poVar9 = Imath_2_5::operator<<(poVar9,(Vec2<float> *)&face_2);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"white xy = ");
  poVar9 = Imath_2_5::operator<<(poVar9,&local_360);
  std::endl<char,std::char_traits<char>>(poVar9);
  fVar24 = W1.y;
  if (W1.y <= -W1.y) {
    fVar24 = -W1.y;
  }
  if (fVar24 * 1e-05 <
      (float)(-(uint)(100.0 < W1.y) & (uint)(W1.y + -100.0) |
             ~-(uint)(100.0 < W1.y) & (uint)(100.0 - W1.y))) {
    __assertion = "equalWithRelError (W1.y, Y, 1e-5F)";
    pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
    uVar8 = 0x55;
  }
  else {
    bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError((Vec2<float> *)&rand_1,&c.red,1e-05);
    if (bVar6) {
      bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError((Vec2<float> *)&face,&c.green,1e-05);
      if (bVar6) {
        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError((Vec2<float> *)&face_2,&c.blue,1e-05);
        if (bVar6) {
          bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError(&local_360,&c.white,1e-05);
          if (bVar6) {
            poVar9 = std::operator<<((ostream *)&std::cout,"conversion from XYZ to RGB");
            std::endl<char,std::char_traits<char>>(poVar9);
            Imf_2_5::XYZtoRGB(&M2,&c,100.0);
            Imath_2_5::operator*(&R1,&M2);
            Imath_2_5::operator*(&G1,&M2);
            Imath_2_5::operator*(&B1,&M2);
            Imath_2_5::operator*(&W1,&M2);
            poVar9 = std::operator<<((ostream *)&std::cout,"red   RGB = ");
            poVar9 = Imath_2_5::operator<<(poVar9,&R2);
            std::endl<char,std::char_traits<char>>(poVar9);
            poVar9 = std::operator<<((ostream *)&std::cout,"green RGB = ");
            poVar9 = Imath_2_5::operator<<(poVar9,&G2);
            std::endl<char,std::char_traits<char>>(poVar9);
            poVar9 = std::operator<<((ostream *)&std::cout,"blue  RGB = ");
            poVar9 = Imath_2_5::operator<<(poVar9,&B2);
            std::endl<char,std::char_traits<char>>(poVar9);
            poVar9 = std::operator<<((ostream *)&std::cout,"white RGB = ");
            poVar9 = Imath_2_5::operator<<(poVar9,&W2);
            std::endl<char,std::char_traits<char>>(poVar9);
            local_388.x = 1.0;
            local_388.y = 0.0;
            local_388.z = 0.0;
            bVar6 = Imath_2_5::Vec3<float>::equalWithAbsError(&R2,&local_388,0.001);
            if (bVar6) {
              local_388.x = 0.0;
              local_388.y = 1.0;
              local_388.z = 0.0;
              bVar6 = Imath_2_5::Vec3<float>::equalWithAbsError(&G2,&local_388,0.001);
              if (bVar6) {
                local_388.x = 0.0;
                local_388.y = 0.0;
                local_388.z = 1.0;
                bVar6 = Imath_2_5::Vec3<float>::equalWithAbsError(&B2,&local_388,0.001);
                if (bVar6) {
                  local_388.x = 1.0;
                  local_388.y = 1.0;
                  local_388.z = 1.0;
                  bVar6 = Imath_2_5::Vec3<float>::equalWithAbsError(&W2,&local_388,0.001);
                  if (bVar6) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&R1,tempDir,"imf_test_chromaticities.exr");
                    uVar4 = R1._0_8_;
                    poVar9 = std::operator<<((ostream *)&std::cout,"chromaticities attribute");
                    std::endl<char,std::char_traits<char>>(poVar9);
                    std::operator<<((ostream *)&std::cout,"writing, ");
                    M1.x[0][0] = 1.0;
                    M1.x[0][1] = 2.0;
                    M2.x[0][0] = 3.0;
                    M2.x[0][1] = 4.0;
                    G1.x = 5.0;
                    G1.y = 6.0;
                    B1.x = 7.0;
                    B1.y = 8.0;
                    Imf_2_5::Chromaticities::Chromaticities
                              (&c,(V2f *)&M1,(V2f *)&M2,(V2f *)&G1,(V2f *)&B1);
                    pVVar17 = (V2f *)&M1;
                    M1.x[0][0] = 0.0;
                    M1.x[0][1] = 0.0;
                    Imf_2_5::Header::Header
                              ((Header *)&M2,100,100,1.0,pVVar17,1.0,INCREASING_Y,ZIP_COMPRESSION);
                    bVar6 = Imf_2_5::hasChromaticities((Header *)&M2);
                    if (bVar6) {
                      __assertion = "hasChromaticities (header) == false";
                      pcVar15 = "void (anonymous namespace)::writeReadChromaticities(const char *)";
                      uVar8 = 0x7c;
                    }
                    else {
                      Imf_2_5::addChromaticities((Header *)&M2,&c);
                      bVar6 = Imf_2_5::hasChromaticities((Header *)&M2);
                      if (bVar6) {
                        iVar7 = Imf_2_5::globalThreadCount();
                        Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                  ((RgbaOutputFile *)&G1,(char *)uVar4,(Header *)&M2,WRITE_RGBA,
                                   iVar7);
                        lVar23 = 100;
                        while( true ) {
                          bVar6 = lVar23 == 0;
                          lVar23 = lVar23 + -1;
                          if (bVar6) break;
                          half::operator=((half *)pVVar17,1.0);
                          half::operator=((half *)((long)&pVVar17->x + 2),1.0);
                          half::operator=((half *)&pVVar17->y,1.0);
                          half::operator=((half *)((long)&pVVar17->y + 2),1.0);
                          pVVar17 = pVVar17 + 1;
                        }
                        Imf_2_5::RgbaOutputFile::setFrameBuffer
                                  ((RgbaOutputFile *)&G1,(Rgba *)&M1,1,0);
                        Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&G1,100);
                        Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                        poVar9 = std::operator<<((ostream *)&std::cout,"reading, comparing");
                        std::endl<char,std::char_traits<char>>(poVar9);
                        iVar7 = Imf_2_5::globalThreadCount();
                        Imf_2_5::RgbaInputFile::RgbaInputFile
                                  ((RgbaInputFile *)&M1,(char *)uVar4,iVar7);
                        pHVar10 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                        pCVar11 = Imf_2_5::chromaticities(pHVar10);
                        pHVar10 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                        bVar6 = Imf_2_5::hasChromaticities(pHVar10);
                        if (!bVar6) {
                          __assert_fail("hasChromaticities (in.header()) == true",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x97,
                                        "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                       );
                        }
                        if ((((c.red.x != (pCVar11->red).x) ||
                             (NAN(c.red.x) || NAN((pCVar11->red).x))) ||
                            (pfVar1 = &(pCVar11->red).y, c.red.y != *pfVar1)) ||
                           (NAN(c.red.y) || NAN(*pfVar1))) {
                          __assert_fail("c1.red == c2.red",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x98,
                                        "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                       );
                        }
                        if (((c.green.x != (pCVar11->green).x) ||
                            (NAN(c.green.x) || NAN((pCVar11->green).x))) ||
                           ((pfVar1 = &(pCVar11->green).y, c.green.y != *pfVar1 ||
                            (NAN(c.green.y) || NAN(*pfVar1))))) {
                          __assert_fail("c1.green == c2.green",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x99,
                                        "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                       );
                        }
                        if (((c.blue.x != (pCVar11->blue).x) ||
                            (NAN(c.blue.x) || NAN((pCVar11->blue).x))) ||
                           ((pfVar1 = &(pCVar11->blue).y, c.blue.y != *pfVar1 ||
                            (NAN(c.blue.y) || NAN(*pfVar1))))) {
                          __assert_fail("c1.blue == c2.blue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x9a,
                                        "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                       );
                        }
                        if ((((c.white.x != (pCVar11->white).x) ||
                             (NAN(c.white.x) || NAN((pCVar11->white).x))) ||
                            (pfVar1 = &(pCVar11->white).y, c.white.y != *pfVar1)) ||
                           (NAN(c.white.y) || NAN(*pfVar1))) {
                          __assert_fail("c1.white == c2.white",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x9b,
                                        "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                       );
                        }
                        Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                        remove((char *)uVar4);
                        Imf_2_5::Header::~Header((Header *)&M2);
                        std::__cxx11::string::~string((string *)&R1);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&M2,tempDir,"imf_test_latlong1.exr");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&c,tempDir,"imf_test_latlong2.exr");
                        uVar4 = M2.x[0]._0_8_;
                        pcVar15 = (char *)CONCAT44(c.red.y,c.red.x);
                        poVar9 = std::operator<<((ostream *)&std::cout,
                                                 "latitude-longitude environment map");
                        std::endl<char,std::char_traits<char>>(poVar9);
                        R1.x = 0.0;
                        R1.y = 0.0;
                        Imf_2_5::Header::Header
                                  ((Header *)&M1,0x168,0xb4,1.0,(V2f *)&R1,1.0,INCREASING_Y,
                                   ZIP_COMPRESSION);
                        R1._0_8_ = R1._0_8_ & 0xffffffff00000000;
                        Imf_2_5::addEnvmap((Header *)&M1,(Envmap *)&R1);
                        R1.x = 0.0;
                        R1.y = 1.0;
                        R1.z = 0.0;
                        Imf_2_5::LatLongMap::latLong((LatLongMap *)&G1,&R1);
                        R2.x = G1.x;
                        R2.y = G1.y;
                        fVar24 = G1.x;
                        if (1e-06 < (float)(-(uint)(1.5707964 < fVar24) &
                                            (uint)(fVar24 + -1.5707964) |
                                           ~-(uint)(1.5707964 < fVar24) & (uint)(1.5707964 - fVar24)
                                           )) {
                          __assert_fail("equalWithAbsError (pos.x, float (M_PI/2), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xaf,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 0.0;
                        R1.y = -1.0;
                        R1.z = 0.0;
                        Imf_2_5::LatLongMap::latLong((LatLongMap *)&G1,&R1);
                        R2.x = G1.x;
                        R2.y = G1.y;
                        fVar24 = G1.x;
                        if (1e-06 < (float)(-(uint)(-1.5707964 < fVar24) &
                                            (uint)(fVar24 + 1.5707964) |
                                           ~-(uint)(-1.5707964 < fVar24) &
                                           (uint)(-1.5707964 - fVar24))) {
                          __assert_fail("equalWithAbsError (pos.x, float (-M_PI/2), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xb2,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 0.0;
                        R1.y = 0.0;
                        R1.z = 1.0;
                        Imf_2_5::LatLongMap::latLong((LatLongMap *)&G1,&R1);
                        R2.x = G1.x;
                        R2.y = G1.y;
                        R1.x = 0.0;
                        R1.y = 0.0;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xb5,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 1.0;
                        R1.y = 0.0;
                        R1.z = 0.0;
                        Imf_2_5::LatLongMap::latLong((LatLongMap *)&G1,&R1);
                        R2.x = G1.x;
                        R2.y = G1.y;
                        R1.x = 0.0;
                        R1.y = 1.5707964;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f (0, M_PI/2), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xb8,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        R1.x = -1.0;
                        R1.y = 0.0;
                        R1.z = 0.0;
                        Imf_2_5::LatLongMap::latLong((LatLongMap *)&G1,&R1);
                        R2.x = G1.x;
                        R2.y = G1.y;
                        R1.x = 0.0;
                        R1.y = -1.5707964;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f (0, -M_PI/2), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xbb,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 0.0;
                        R1.y = 1.0;
                        R1.z = 1.0;
                        Imf_2_5::LatLongMap::latLong((LatLongMap *)&G1,&R1);
                        R2.x = G1.x;
                        R2.y = G1.y;
                        R1.x = 0.7853982;
                        R1.y = 0.0;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f (M_PI/4, 0), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xbe,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 0.0;
                        R1.y = -1.0;
                        stack0xfffffffffffffb58 = CONCAT44(iStack_4a4,0x3f800000);
                        Imf_2_5::LatLongMap::latLong((LatLongMap *)&G1,&R1);
                        R2.x = G1.x;
                        R2.y = G1.y;
                        R1.x = -0.7853982;
                        R1.y = 0.0;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f (-M_PI/4, 0), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xc1,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        G1.x = 1.5707964;
                        G1.y = 3.1415927;
                        Imf_2_5::LatLongMap::pixelPosition(pBVar12,(V2f *)&G1);
                        R2.x = R1.x;
                        R2.y = R1.y;
                        R1.x = 0.0;
                        R1.y = 0.0;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.00036);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f * W)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xc4,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        G1.x = -1.5707964;
                        G1.y = -3.1415927;
                        Imf_2_5::LatLongMap::pixelPosition(pBVar12,(V2f *)&G1);
                        R2.x = R1.x;
                        R2.y = R1.y;
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        R1.x = (float)(pBVar12->max).x;
                        R1.y = (float)(pBVar12->max).y;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.00036);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f (header.dataWindow().max), 1e-6f * W)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,199,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 2.52234e-43;
                        R1.y = 0.0;
                        stack0xfffffffffffffb58 = 0x168;
                        pRVar13 = (Rgba *)operator_new__(0x7e900);
                        lVar20 = 0;
                        for (lVar23 = 0; lVar23 != 0xb4; lVar23 = lVar23 + 1) {
                          lVar18 = 0;
                          for (lVar21 = 0; uVar5 = stack0xfffffffffffffb58, lVar21 != 0x168;
                              lVar21 = lVar21 + 1) {
                            pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                            B1.y = (float)(int)lVar23;
                            B1.x = (float)(int)lVar21;
                            Imf_2_5::LatLongMap::direction((LatLongMap *)&G1,pBVar12,(V2f *)&B1);
                            lVar22 = uVar5 * lVar20;
                            half::operator=((half *)((long)&(pRVar13->r)._h + lVar22 + lVar18),
                                            G1.x + 1.0);
                            half::operator=((half *)((long)&(pRVar13->g)._h + lVar18 + lVar22),
                                            G1.y + 1.0);
                            half::operator=((half *)((long)&(pRVar13->b)._h + lVar18 + lVar22),
                                            G1.z + 1.0);
                            lVar18 = lVar18 + 8;
                          }
                          lVar20 = lVar20 + 8;
                        }
                        iVar7 = Imf_2_5::globalThreadCount();
                        Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                  ((RgbaOutputFile *)&G1,(char *)uVar4,(Header *)&M1,WRITE_RGB,iVar7
                                  );
                        Imf_2_5::RgbaOutputFile::setFrameBuffer
                                  ((RgbaOutputFile *)&G1,pRVar13,1,0x168);
                        Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&G1,0xb4);
                        Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                        B2.x = 1.5365222e+16;
                        B2.y._0_2_ = 0x5a5a;
                        iVar7 = 0x2f760;
                        while (bVar6 = iVar7 != 0, iVar7 = iVar7 + -1, bVar6) {
                          Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>
                                    ((Imath_2_5 *)&G1,(Rand48 *)&B2);
                          pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          Imf_2_5::LatLongMap::pixelPosition((LatLongMap *)&G2,pBVar12,&G1);
                          pRVar2 = pRVar13 + (long)(int)(G2.y + 0.5) * stack0xfffffffffffffb58 +
                                             (long)(int)(G2.x + 0.5);
                          half::operator=(&pRVar2->r,(G1.x + 1.0) * 0.8);
                          half::operator=(&pRVar2->g,(G1.y + 1.0) * 0.8);
                          half::operator=(&pRVar2->b,(G1.z + 1.0) * 0.8);
                          pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          Imf_2_5::LatLongMap::direction((LatLongMap *)&B1,pBVar12,(V2f *)&G2);
                          Imath_2_5::Vec3<float>::normalized(&W1);
                          bVar6 = Imath_2_5::Vec3<float>::equalWithAbsError
                                            ((Vec3<float> *)&G1,&W1,1e-05);
                          if (!bVar6) {
                            __assert_fail("dir.equalWithAbsError (dir1.normalized(), 1e-5f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0xec,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                        }
                        iVar7 = Imf_2_5::globalThreadCount();
                        Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                  ((RgbaOutputFile *)&G1,pcVar15,(Header *)&M1,WRITE_RGB,iVar7);
                        Imf_2_5::RgbaOutputFile::setFrameBuffer
                                  ((RgbaOutputFile *)&G1,pRVar13,1,0x168);
                        Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&G1,0xb4);
                        Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                        remove((char *)uVar4);
                        remove(pcVar15);
                        Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&R1);
                        Imf_2_5::Header::~Header((Header *)&M1);
                        std::__cxx11::string::~string((string *)&c);
                        std::__cxx11::string::~string((string *)&M2);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&M2,tempDir,"imf_test_cube1.exr");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&c,tempDir,"imf_test_cube2.exr");
                        uVar4 = M2.x[0]._0_8_;
                        pcVar15 = (char *)CONCAT44(c.red.y,c.red.x);
                        poVar9 = std::operator<<((ostream *)&std::cout,"cube environment map");
                        std::endl<char,std::char_traits<char>>(poVar9);
                        R1.x = 0.0;
                        R1.y = 0.0;
                        Imf_2_5::Header::Header
                                  ((Header *)&M1,0x80,0x300,1.0,(V2f *)&R1,1.0,INCREASING_Y,
                                   ZIP_COMPRESSION);
                        R1.x = 1.4013e-45;
                        Imf_2_5::addEnvmap((Header *)&M1,(Envmap *)&R1);
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        iVar7 = Imf_2_5::CubeMap::sizeOfFace(pBVar12);
                        if (iVar7 != 0x80) {
                          __assert_fail("sof == N",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x108,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        CVar16 = CUBEFACE_POS_X;
                        while (CVar16 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y)) {
                          pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          Imf_2_5::CubeMap::dataWindowForFace((CubeMap *)&R1,CVar16,pBVar12);
                          if ((int)R1.z - (int)R1.x != 0x7f) {
                            __assert_fail("dw1.max.x - dw1.min.x == sof - 1",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x10f,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          if (iStack_4a4 - (int)R1.y != 0x7f) {
                            __assert_fail("dw1.max.y - dw1.min.y == sof - 1",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x110,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          bVar6 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::intersects
                                            (pBVar12,(Vec2<int> *)&R1);
                          if (!bVar6) {
                            __assert_fail("header.dataWindow().intersects (dw1.min)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x111,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          bVar6 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::intersects
                                            (pBVar12,(Vec2<int> *)&R1.z);
                          if (!bVar6) {
                            __assert_fail("header.dataWindow().intersects (dw1.max)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x112,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          CVar16 = CVar16 + CUBEFACE_NEG_X;
                          for (face_00 = CVar16; face_00 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y);
                              face_00 = face_00 + CUBEFACE_NEG_X) {
                            pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                            Imf_2_5::CubeMap::dataWindowForFace((CubeMap *)&G1,face_00,pBVar12);
                            if ((int)R1.x <= (int)G1.z) {
                              if (((int)G1.x <= (int)R1.z) && ((int)R1.y <= local_484)) {
                                if ((int)G1.y <= iStack_4a4) {
                                  __assert_fail("!dw1.intersects (dw2)",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                ,0x118,
                                                "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                               );
                                }
                              }
                            }
                          }
                        }
                        R1.x = 1.0;
                        R1.y = 0.0;
                        stack0xfffffffffffffb58 = stack0xfffffffffffffb58 & 0xffffffff00000000;
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::faceAndPixelPosition(&R1,pBVar12,&face,(V2f *)&R2);
                        if (face != CUBEFACE_POS_X) {
                          __assert_fail("face == CUBEFACE_POS_X",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x123,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 63.5;
                        R1.y = 63.5;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x124,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = -1.0;
                        R1.y = 0.0;
                        stack0xfffffffffffffb58 = stack0xfffffffffffffb58 & 0xffffffff00000000;
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::faceAndPixelPosition(&R1,pBVar12,&face,(V2f *)&R2);
                        if (face != CUBEFACE_NEG_X) {
                          __assert_fail("face == CUBEFACE_NEG_X",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x12a,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 63.5;
                        R1.y = 63.5;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,299,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 0.0;
                        R1.y = 1.0;
                        stack0xfffffffffffffb58 = stack0xfffffffffffffb58 & 0xffffffff00000000;
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::faceAndPixelPosition(&R1,pBVar12,&face,(V2f *)&R2);
                        if (face != CUBEFACE_POS_Y) {
                          __assert_fail("face == CUBEFACE_POS_Y",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x131,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 63.5;
                        R1.y = 63.5;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x132,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 0.0;
                        R1.y = -1.0;
                        stack0xfffffffffffffb58 = stack0xfffffffffffffb58 & 0xffffffff00000000;
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::faceAndPixelPosition(&R1,pBVar12,&face,(V2f *)&R2);
                        if (face != CUBEFACE_NEG_Y) {
                          __assert_fail("face == CUBEFACE_NEG_Y",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x138,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 63.5;
                        R1.y = 63.5;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x139,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 0.0;
                        R1.y = 0.0;
                        R1.z = 1.0;
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::faceAndPixelPosition(&R1,pBVar12,&face,(V2f *)&R2);
                        if (face != CUBEFACE_POS_Z) {
                          __assert_fail("face == CUBEFACE_POS_Z",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x13f,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 63.5;
                        R1.y = 63.5;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x140,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 0.0;
                        R1.y = 0.0;
                        stack0xfffffffffffffb58 = CONCAT44(iStack_4a4,0xbf800000);
                        pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::faceAndPixelPosition(&R1,pBVar12,&face,(V2f *)&R2);
                        if (face != CUBEFACE_NEG_Z) {
                          __assert_fail("face == CUBEFACE_NEG_Z",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x146,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 63.5;
                        R1.y = 63.5;
                        bVar6 = Imath_2_5::Vec2<float>::equalWithAbsError
                                          ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                        if (!bVar6) {
                          __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x147,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        R1.x = 1.0762e-42;
                        R1.y = 0.0;
                        stack0xfffffffffffffb58 = 0x80;
                        pRVar13 = (Rgba *)operator_new__(0xc0000);
                        lVar20 = 0;
                        for (lVar23 = 0; lVar23 != 0x300; lVar23 = lVar23 + 1) {
                          for (lVar18 = 4; lVar18 != 0x404; lVar18 = lVar18 + 8) {
                            lVar21 = stack0xfffffffffffffb58 * lVar20;
                            this_00 = (half *)((long)&(pRVar13->r)._h + lVar21 + lVar18);
                            phVar14 = half::operator=(this_00,0.0);
                            uVar3 = phVar14->_h;
                            *(unsigned_short *)((long)pRVar13 + lVar18 + -2 + lVar21) = uVar3;
                            this_00[-2]._h = uVar3;
                          }
                          lVar20 = lVar20 + 8;
                        }
                        for (CVar16 = CUBEFACE_POS_X; CVar16 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y);
                            CVar16 = CVar16 + CUBEFACE_NEG_X) {
                          for (iVar7 = 0; iVar7 != 0x80; iVar7 = iVar7 + 1) {
                            for (iVar19 = 0; iVar19 != 0x80; iVar19 = iVar19 + 1) {
                              pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                              G2.x = (float)iVar19;
                              G2.y = (float)iVar7;
                              Imf_2_5::CubeMap::pixelPosition
                                        ((CubeMap *)&B1,CVar16,pBVar12,(V2f *)&G2);
                              lVar23 = (long)(int)(B1.y + 0.5) * stack0xfffffffffffffb58;
                              fVar24 = B1.x;
                              pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                              W1.x = (float)iVar19;
                              W1.y = (float)iVar7;
                              Imf_2_5::CubeMap::direction((CubeMap *)&G1,CVar16,pBVar12,(V2f *)&W1);
                              Imath_2_5::Vec3<float>::normalize(&G1);
                              pRVar2 = pRVar13 + lVar23 + (int)(fVar24 + 0.5);
                              half::operator=(&pRVar2->r,G1.x + 1.0);
                              half::operator=(&pRVar2->g,G1.y + 1.0);
                              half::operator=(&pRVar2->b,G1.z + 1.0);
                            }
                          }
                        }
                        iVar7 = Imf_2_5::globalThreadCount();
                        Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                  ((RgbaOutputFile *)&G1,(char *)uVar4,(Header *)&M1,WRITE_RGB,iVar7
                                  );
                        Imf_2_5::RgbaOutputFile::setFrameBuffer
                                  ((RgbaOutputFile *)&G1,pRVar13,1,0x80);
                        Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&G1,0x300);
                        Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                        phVar14 = &pRVar13->b;
                        for (lVar23 = 0; lVar23 != 0x300; lVar23 = lVar23 + 1) {
                          for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 1) {
                            if (((*(float *)((long)&half::_toFloat +
                                            (ulong)phVar14[lVar20 * 4 + -2]._h * 4) == 0.0) &&
                                (fVar24 = *(float *)((long)&half::_toFloat +
                                                    (ulong)phVar14[lVar20 * 4 + -1]._h * 4),
                                fVar24 == 0.0)) &&
                               ((!NAN(fVar24) &&
                                ((fVar24 = *(float *)((long)&half::_toFloat +
                                                     (ulong)phVar14[lVar20 * 4]._h * 4),
                                 fVar24 == 0.0 && (!NAN(fVar24))))))) {
                              __assert_fail("p.r != 0 || p.g != 0 || p.b != 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                            ,0x177,
                                            "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                           );
                            }
                          }
                          phVar14 = phVar14 + stack0xfffffffffffffb58 * 4;
                        }
                        rand_1._state[0] = 0x5a5a;
                        rand_1._state[1] = 0x5a5a;
                        rand_1._state[2] = 0x5a5a;
                        iVar7 = 0x48000;
                        while (bVar6 = iVar7 != 0, iVar7 = iVar7 + -1, bVar6) {
                          Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>
                                    ((Imath_2_5 *)&G1,&rand_1);
                          pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          Imf_2_5::CubeMap::faceAndPixelPosition(&G1,pBVar12,&face_2,(V2f *)&B2);
                          CVar16 = face_2;
                          pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          local_388.y._0_2_ = B2.y._0_2_;
                          local_388.x = B2.x;
                          local_388.y._2_2_ = B2.y._2_2_;
                          Imf_2_5::CubeMap::pixelPosition
                                    ((CubeMap *)&W2,CVar16,pBVar12,(V2f *)&local_388);
                          pRVar2 = pRVar13 + (long)(int)(W2.y + 0.5) * stack0xfffffffffffffb58 +
                                             (long)(int)(W2.x + 0.5);
                          half::operator=(&pRVar2->r,(G1.x + 1.0) * 0.8);
                          half::operator=(&pRVar2->g,(G1.y + 1.0) * 0.8);
                          half::operator=(&pRVar2->b,(G1.z + 1.0) * 0.8);
                          CVar16 = face_2;
                          pBVar12 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          Imf_2_5::CubeMap::direction((CubeMap *)&B1,CVar16,pBVar12,(V2f *)&B2);
                          Imath_2_5::Vec3<float>::normalized(&W1);
                          bVar6 = Imath_2_5::Vec3<float>::equalWithAbsError(&G1,&W1,1e-06);
                          if (!bVar6) {
                            __assert_fail("dir.equalWithAbsError (dir1.normalized(), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,399,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                        }
                        iVar7 = Imf_2_5::globalThreadCount();
                        Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                  ((RgbaOutputFile *)&G1,pcVar15,(Header *)&M1,WRITE_RGB,iVar7);
                        Imf_2_5::RgbaOutputFile::setFrameBuffer
                                  ((RgbaOutputFile *)&G1,pRVar13,1,0x80);
                        Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&G1,0x300);
                        Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                        remove((char *)uVar4);
                        remove(pcVar15);
                        Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&R1);
                        Imf_2_5::Header::~Header((Header *)&M1);
                        std::__cxx11::string::~string((string *)&c);
                        std::__cxx11::string::~string((string *)&M2);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&c,tempDir,"imf_test_keycode.exr");
                        pcVar15 = (char *)CONCAT44(c.red.y,c.red.x);
                        poVar9 = std::operator<<((ostream *)&std::cout,"key code attribute");
                        std::endl<char,std::char_traits<char>>(poVar9);
                        std::operator<<((ostream *)&std::cout,"writing, ");
                        Imf_2_5::KeyCode::KeyCode((KeyCode *)&R1,0xc,0x22,0x1e240,0x4d2,0x2d,3,0x50)
                        ;
                        iVar7 = Imf_2_5::KeyCode::filmMfcCode((KeyCode *)&R1);
                        if (iVar7 != 0xc) {
                          __assert_fail("k1.filmMfcCode() == 12",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1ac,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::filmType((KeyCode *)&R1);
                        if (iVar7 != 0x22) {
                          __assert_fail("k1.filmType() == 34",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1ad,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::prefix((KeyCode *)&R1);
                        if (iVar7 != 0x1e240) {
                          __assert_fail("k1.prefix() == 123456",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1ae,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::count((KeyCode *)&R1);
                        if (iVar7 != 0x4d2) {
                          __assert_fail("k1.count() == 1234",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1af,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::perfOffset((KeyCode *)&R1);
                        if (iVar7 != 0x2d) {
                          __assert_fail("k1.perfOffset() == 45",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1b0,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::perfsPerFrame((KeyCode *)&R1);
                        if (iVar7 != 3) {
                          __assert_fail("k1.perfsPerFrame() == 3",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1b1,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::perfsPerCount((KeyCode *)&R1);
                        if (iVar7 != 0x50) {
                          __assert_fail("k1.perfsPerCount() == 80",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1b2,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        pVVar17 = (V2f *)&M1;
                        M1.x[0][0] = 0.0;
                        M1.x[0][1] = 0.0;
                        Imf_2_5::Header::Header
                                  ((Header *)&M2,100,100,1.0,pVVar17,1.0,INCREASING_Y,
                                   ZIP_COMPRESSION);
                        bVar6 = Imf_2_5::hasKeyCode((Header *)&M2);
                        if (bVar6) {
                          __assert_fail("hasKeyCode (header) == false",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1b8,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        Imf_2_5::addKeyCode((Header *)&M2,(KeyCode *)&R1);
                        bVar6 = Imf_2_5::hasKeyCode((Header *)&M2);
                        if (!bVar6) {
                          __assert_fail("hasKeyCode (header) == true",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1bb,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::globalThreadCount();
                        Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                  ((RgbaOutputFile *)&G1,pcVar15,(Header *)&M2,WRITE_RGBA,iVar7);
                        lVar23 = 100;
                        while (bVar6 = lVar23 != 0, lVar23 = lVar23 + -1, bVar6) {
                          half::operator=((half *)pVVar17,1.0);
                          half::operator=((half *)((long)&pVVar17->x + 2),1.0);
                          half::operator=((half *)&pVVar17->y,1.0);
                          half::operator=((half *)((long)&pVVar17->y + 2),1.0);
                          pVVar17 = pVVar17 + 1;
                        }
                        Imf_2_5::RgbaOutputFile::setFrameBuffer
                                  ((RgbaOutputFile *)&G1,(Rgba *)&M1,1,0);
                        Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&G1,100);
                        Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                        poVar9 = std::operator<<((ostream *)&std::cout,"reading, comparing");
                        std::endl<char,std::char_traits<char>>(poVar9);
                        iVar7 = Imf_2_5::globalThreadCount();
                        Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&M1,pcVar15,iVar7);
                        pHVar10 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                        this = Imf_2_5::keyCode(pHVar10);
                        pHVar10 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                        bVar6 = Imf_2_5::hasKeyCode(pHVar10);
                        if (!bVar6) {
                          __assert_fail("hasKeyCode (in.header()) == true",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1d3,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::filmMfcCode((KeyCode *)&R1);
                        iVar19 = Imf_2_5::KeyCode::filmMfcCode(this);
                        if (iVar7 != iVar19) {
                          __assert_fail("k1.filmMfcCode() == k2.filmMfcCode()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1d4,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::filmType((KeyCode *)&R1);
                        iVar19 = Imf_2_5::KeyCode::filmType(this);
                        if (iVar7 != iVar19) {
                          __assert_fail("k1.filmType() == k2.filmType()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1d5,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::prefix((KeyCode *)&R1);
                        iVar19 = Imf_2_5::KeyCode::prefix(this);
                        if (iVar7 != iVar19) {
                          __assert_fail("k1.prefix() == k2.prefix()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1d6,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::count((KeyCode *)&R1);
                        iVar19 = Imf_2_5::KeyCode::count(this);
                        if (iVar7 != iVar19) {
                          __assert_fail("k1.count() == k2.count()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1d7,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::perfOffset((KeyCode *)&R1);
                        iVar19 = Imf_2_5::KeyCode::perfOffset(this);
                        if (iVar7 != iVar19) {
                          __assert_fail("k1.perfOffset() == k2.perfOffset()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1d8,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::perfsPerFrame((KeyCode *)&R1);
                        iVar19 = Imf_2_5::KeyCode::perfsPerFrame(this);
                        if (iVar7 != iVar19) {
                          __assert_fail("k1.perfsPerFrame() == k2.perfsPerFrame()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1d9,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        iVar7 = Imf_2_5::KeyCode::perfsPerCount((KeyCode *)&R1);
                        iVar19 = Imf_2_5::KeyCode::perfsPerCount(this);
                        if (iVar7 != iVar19) {
                          __assert_fail("k1.perfsPerCount() == k2.perfsPerCount()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1da,
                                        "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                       );
                        }
                        Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                        remove(pcVar15);
                        Imf_2_5::Header::~Header((Header *)&M2);
                        std::__cxx11::string::~string((string *)&c);
                        poVar9 = std::operator<<((ostream *)&std::cout,"time code methods");
                        std::endl<char,std::char_traits<char>>(poVar9);
                        Imf_2_5::TimeCode::TimeCode((TimeCode *)&M1);
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0) {
                          __assert_fail("t.timeAndFlags() == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1e8,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::userData((TimeCode *)&M1);
                        if (uVar8 != 0) {
                          __assert_fail("t.userData() == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1e9,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                        Imf_2_5::TimeCode::setFrame((TimeCode *)&M1,0x1d);
                        iVar7 = Imf_2_5::TimeCode::frame((TimeCode *)&M1);
                        if (iVar7 != 0x1d) {
                          __assert_fail("t.frame() == 29",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1ef,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0x29) {
                          __assert_fail("t.timeAndFlags() == 0x00000029",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1f0,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                        Imf_2_5::TimeCode::setFrame((TimeCode *)&M1,0);
                        iVar7 = Imf_2_5::TimeCode::frame((TimeCode *)&M1);
                        if (iVar7 != 0) {
                          __assert_fail("t.frame() == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,500,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0xffffffc0) {
                          __assert_fail("t.timeAndFlags() == 0xffffffc0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1f5,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                        Imf_2_5::TimeCode::setSeconds((TimeCode *)&M1,0x3b);
                        iVar7 = Imf_2_5::TimeCode::seconds((TimeCode *)&M1);
                        if (iVar7 != 0x3b) {
                          __assert_fail("t.seconds() == 59",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1fb,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0x5900) {
                          __assert_fail("t.timeAndFlags() == 0x00005900",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x1fc,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                        Imf_2_5::TimeCode::setSeconds((TimeCode *)&M1,0);
                        iVar7 = Imf_2_5::TimeCode::seconds((TimeCode *)&M1);
                        if (iVar7 != 0) {
                          __assert_fail("t.seconds() == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x200,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0xffff80ff) {
                          __assert_fail("t.timeAndFlags() == 0xffff80ff",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x201,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                        Imf_2_5::TimeCode::setMinutes((TimeCode *)&M1,0x3b);
                        iVar7 = Imf_2_5::TimeCode::minutes((TimeCode *)&M1);
                        if (iVar7 != 0x3b) {
                          __assert_fail("t.minutes() == 59",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x207,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0x590000) {
                          __assert_fail("t.timeAndFlags() == 0x00590000",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x208,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                        Imf_2_5::TimeCode::setMinutes((TimeCode *)&M1,0);
                        iVar7 = Imf_2_5::TimeCode::minutes((TimeCode *)&M1);
                        if (iVar7 != 0) {
                          __assert_fail("t.minutes() == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x20c,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0xff80ffff) {
                          __assert_fail("t.timeAndFlags() == 0xff80ffff",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x20d,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                        Imf_2_5::TimeCode::setHours((TimeCode *)&M1,0x17);
                        iVar7 = Imf_2_5::TimeCode::hours((TimeCode *)&M1);
                        if (iVar7 != 0x17) {
                          __assert_fail("t.hours() == 23",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x213,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0x23000000) {
                          __assert_fail("t.timeAndFlags() == 0x23000000",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x214,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                        Imf_2_5::TimeCode::setHours((TimeCode *)&M1,0);
                        iVar7 = Imf_2_5::TimeCode::hours((TimeCode *)&M1);
                        if (iVar7 != 0) {
                          __assert_fail("t.hours() == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x218,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0xc0ffffff) {
                          __assert_fail("t.timeAndFlags() == 0xc0ffffff",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x219,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                        Imf_2_5::TimeCode::setDropFrame((TimeCode *)&M1,true);
                        bVar6 = Imf_2_5::TimeCode::dropFrame((TimeCode *)&M1);
                        if (!bVar6) {
                          __assert_fail("t.dropFrame() == true",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x21f,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0x40) {
                          __assert_fail("t.timeAndFlags() == 0x00000040",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x220,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                        Imf_2_5::TimeCode::setDropFrame((TimeCode *)&M1,false);
                        bVar6 = Imf_2_5::TimeCode::dropFrame((TimeCode *)&M1);
                        if (bVar6) {
                          __assert_fail("t.dropFrame() == false",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x224,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0xffffffbf) {
                          __assert_fail("t.timeAndFlags() == 0xffffffbf",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x225,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                        Imf_2_5::TimeCode::setColorFrame((TimeCode *)&M1,true);
                        bVar6 = Imf_2_5::TimeCode::colorFrame((TimeCode *)&M1);
                        if (!bVar6) {
                          __assert_fail("t.colorFrame() == true",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x22b,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0x80) {
                          __assert_fail("t.timeAndFlags() == 0x00000080",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x22c,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                        Imf_2_5::TimeCode::setColorFrame((TimeCode *)&M1,false);
                        bVar6 = Imf_2_5::TimeCode::colorFrame((TimeCode *)&M1);
                        if (bVar6) {
                          __assert_fail("t.colorFrame() == false",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x230,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0xffffff7f) {
                          __assert_fail("t.timeAndFlags() == 0xffffff7f",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x231,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                        Imf_2_5::TimeCode::setFieldPhase((TimeCode *)&M1,true);
                        bVar6 = Imf_2_5::TimeCode::fieldPhase((TimeCode *)&M1);
                        if (!bVar6) {
                          __assert_fail("t.fieldPhase() == true",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x237,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        uVar8 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                        if (uVar8 != 0x8000) {
                          __assert_fail("t.timeAndFlags (TimeCode::TV60_PACKING) == 0x00008000",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x238,"void (anonymous namespace)::timeCodeMethods()");
                        }
                        Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV50_PACKING);
                        __assert_fail("t.timeAndFlags (TimeCode::TV50_PACKING) == 0x80000000",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x239,"void (anonymous namespace)::timeCodeMethods()");
                      }
                      __assertion = "hasChromaticities (header) == true";
                      pcVar15 = "void (anonymous namespace)::writeReadChromaticities(const char *)";
                      uVar8 = 0x7f;
                    }
                  }
                  else {
                    __assertion = "W2.equalWithAbsError (V3f (1, 1, 1), 1e-3F)";
                    pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
                    uVar8 = 0x6c;
                  }
                }
                else {
                  __assertion = "B2.equalWithAbsError (V3f (0, 0, 1), 1e-3F)";
                  pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
                  uVar8 = 0x6b;
                }
              }
              else {
                __assertion = "G2.equalWithAbsError (V3f (0, 1, 0), 1e-3F)";
                pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
                uVar8 = 0x6a;
              }
            }
            else {
              __assertion = "R2.equalWithAbsError (V3f (1, 0, 0), 1e-3F)";
              pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
              uVar8 = 0x69;
            }
          }
          else {
            __assertion = "w1.equalWithAbsError (c.white, 1e-5F)";
            pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
            uVar8 = 0x59;
          }
        }
        else {
          __assertion = "b1.equalWithAbsError (c.blue, 1e-5F)";
          pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
          uVar8 = 0x58;
        }
      }
      else {
        __assertion = "g1.equalWithAbsError (c.green, 1e-5F)";
        pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
        uVar8 = 0x57;
      }
    }
    else {
      __assertion = "r1.equalWithAbsError (c.red, 1e-5F)";
      pcVar15 = "void (anonymous namespace)::convertRGBtoXYZ()";
      uVar8 = 0x56;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                ,uVar8,pcVar15);
}

Assistant:

void
testStandardAttributes (const std::string &tempDir)
{
    try
    {
	cout << "Testing optional standard attributes" << endl;

	convertRGBtoXYZ();

	{
	    std::string filename = tempDir + "imf_test_chromaticities.exr";
	    writeReadChromaticities (filename.c_str());
	}

	{
	    std::string fn1 = tempDir + "imf_test_latlong1.exr";
	    std::string fn2 = tempDir + "imf_test_latlong2.exr";
	    latLongMap (fn1.c_str(), fn2.c_str());
	}

	{
	    std::string fn1 = tempDir + "imf_test_cube1.exr";
	    std::string fn2 = tempDir + "imf_test_cube2.exr";
	    cubeMap (fn1.c_str(), fn2.c_str());
	}

	{
	    std::string filename = tempDir + "imf_test_keycode.exr";
	    writeReadKeyCode (filename.c_str());
	}

	{
	    timeCodeMethods();
	    std::string filename = tempDir + "imf_test_timecode.exr";
	    writeReadTimeCode (filename.c_str());
	}

	{
	    rationalMethods();
	    std::string filename = tempDir + "imf_test_rational.exr";
	    writeReadRational (filename.c_str());
	}

	generatedFunctions();

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}